

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disabled_tests_decl.cpp
# Opt level: O1

void __thiscall
iu_FooP_x_iutest_x_DISABLED_Bar_Test::iu_FooP_x_iutest_x_DISABLED_Bar_Test
          (iu_FooP_x_iutest_x_DISABLED_Bar_Test *this)

{
  TestWithParam<int> *pTVar1;
  EVP_PKEY_CTX *in_RSI;
  
  (this->super_type).super_TestWithParam<int>.super_Test._vptr_Test =
       (_func_int **)&PTR__Test_00147d80;
  (this->super_type).super_TestWithParam<int>.super_Test.test_info_ = (TestInfo *)0x0;
  (this->super_type).super_TestWithParam<int>.super_Test.m_test_info = (iuITestInfoMediator *)0x0;
  pTVar1 = &(this->super_type).super_TestWithParam<int>;
  (pTVar1->super_Test).m_random.m_engine.m_v3 = 0x6c078965;
  (pTVar1->super_Test).m_random.m_engine.m_v4 = 0;
  pTVar1 = &(this->super_type).super_TestWithParam<int>;
  (pTVar1->super_Test).m_random.m_engine.m_v1 = 0x2016830a;
  (pTVar1->super_Test).m_random.m_engine.m_v2 = 0x714acb3e;
  iutest::detail::iuRandom::init
            (&(this->super_type).super_TestWithParam<int>.super_Test.m_random,in_RSI);
  (this->super_type).super_TestWithParam<int>.super_Test.m_random_seed = 0;
  iutest::Test::Observer<void>::s_current = (Test *)this;
  (this->super_type).super_TestWithParam<int>.super_Test._vptr_Test =
       (_func_int **)&PTR__TestWithParam_00147568;
  (this->super_type).super_TestWithParam<int>.super_WithParamInterface<int>._vptr_WithParamInterface
       = (_func_int **)&PTR__iu_FooP_x_iutest_x_DISABLED_Bar_Test_001475a8;
  return;
}

Assistant:

IUTEST_P(FooP, DISABLED_Bar)
{
    int v = GetParam();
    IUTEST_FAIL() << v;
}